

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

SeatPromptResult *
term_get_userpass_input(SeatPromptResult *__return_storage_ptr__,Terminal *term,prompts_t *p)

{
  prompt_t *ppVar1;
  undefined8 uVar2;
  SeatPromptResult spr;
  SeatPromptResult spr_00;
  SeatPromptResult spr_01;
  bool bVar3;
  undefined4 uVar4;
  prompts_t *ppVar5;
  prompts_t *ppVar6;
  _Bool _Var7;
  int iVar8;
  ptrlen pVar9;
  ptrlen pVar10;
  LdiscInputToken LVar11;
  _Bool local_1e1;
  SeatPromptResult local_1a0;
  ptrlen local_180;
  SeatPromptResult local_170;
  ptrlen local_150;
  ptrlen local_140;
  ptrlen local_130;
  ptrlen local_120;
  byte local_109;
  undefined1 auStack_108 [7];
  char c;
  LdiscInputToken local_100;
  undefined8 local_f4;
  LdiscInputToken tok;
  _Bool finished_prompt;
  prompt_t *pr;
  wchar_t i;
  ptrlen plinst;
  ptrlen plname;
  _func_void_SeatPromptResult_BinarySink_ptr *local_58;
  char *local_50;
  undefined8 local_48;
  ulong *local_40;
  term_userpass_state *s;
  _func_void_SeatPromptResult_BinarySink_ptr *local_30;
  char *local_28;
  uint local_20;
  undefined4 uStack_1c;
  prompts_t *local_18;
  prompts_t *p_local;
  Terminal *term_local;
  
  local_18 = p;
  p_local = (prompts_t *)term;
  if (term->ldisc == (Ldisc *)0x0) {
    make_spr_sw_abort_static((SeatPromptResult *)&s,"Terminal not prepared for interactive prompts")
    ;
    spr.errfn = local_30;
    spr._0_8_ = s;
    spr.errdata_lit = local_28;
    spr.errdata_u = local_20;
    spr._28_4_ = uStack_1c;
    signal_prompts_t(__return_storage_ptr__,term,p,spr);
  }
  else if ((p->spr).kind == SPRK_INCOMPLETE) {
    local_40 = (ulong *)p->data;
    if (local_40 == (ulong *)0x0) {
      local_40 = (ulong *)safemalloc(1,0x10,0);
      ppVar5 = local_18;
      local_18->data = local_40;
      make_spr_simple((SeatPromptResult *)&plname.len,SPRK_INCOMPLETE);
      *(size_t *)&ppVar5->spr = plname.len;
      (ppVar5->spr).errfn = local_58;
      (ppVar5->spr).errdata_lit = local_50;
      *(undefined8 *)&(ppVar5->spr).errdata_u = local_48;
      *local_40 = 0;
      *(undefined1 *)(local_40 + 1) = 0;
      if (((local_18->name_reqd & 1U) != 0) && (local_18->name != (char *)0x0)) {
        pVar9 = ptrlen_from_asciz(local_18->name);
        term_write((Terminal *)p_local,pVar9);
        pVar10 = make_ptrlen("\n",1);
        _Var7 = ptrlen_endswith(pVar9,pVar10,(ptrlen *)0x0);
        ppVar5 = p_local;
        if (!_Var7) {
          pVar9 = make_ptrlen("\r\n",2);
          term_write((Terminal *)ppVar5,pVar9);
        }
      }
      if (local_18->instruction != (char *)0x0) {
        pVar9 = ptrlen_from_asciz(local_18->instruction);
        term_write((Terminal *)p_local,pVar9);
        pVar10 = make_ptrlen("\n",1);
        _Var7 = ptrlen_endswith(pVar9,pVar10,(ptrlen *)0x0);
        ppVar5 = p_local;
        if (!_Var7) {
          pVar9 = make_ptrlen("\r\n",2);
          term_write((Terminal *)ppVar5,pVar9);
        }
      }
      for (pr._4_4_ = 0; pr._4_4_ < (int)local_18->n_prompts; pr._4_4_ = pr._4_4_ + 1) {
        prompt_set_result(local_18->prompts[pr._4_4_],"");
      }
    }
LAB_001179c1:
    ppVar5 = p_local;
    if (*local_40 < local_18->n_prompts) {
      ppVar1 = local_18->prompts[*local_40];
      bVar3 = false;
      if ((local_40[1] & 1) == 0) {
        join_0x00000010_0x00000000_ = ptrlen_from_asciz(ppVar1->prompt);
        term_write((Terminal *)ppVar5,join_0x00000010_0x00000000_);
        *(undefined1 *)(local_40 + 1) = 1;
      }
      _Var7 = ldisc_has_input_buffered((Ldisc *)p_local[0x21].callback);
      if (_Var7) {
LAB_00117a66:
        local_1e1 = false;
        if (!bVar3) {
          local_1e1 = ldisc_has_input_buffered((Ldisc *)p_local[0x21].callback);
        }
        if (local_1e1 != false) {
          LVar11 = ldisc_get_input_token((Ldisc *)p_local[0x21].callback);
          ppVar5 = p_local;
          _auStack_108 = LVar11._0_8_;
          uVar2 = _auStack_108;
          local_f4 = _auStack_108;
          local_100._0_4_ = LVar11.field_1._4_4_;
          uVar4._0_1_ = local_100.is_special;
          uVar4._1_3_ = local_100._1_3_;
          tok.is_special = local_100.is_special;
          tok._1_3_ = local_100._1_3_;
          _auStack_108 = LVar11;
          if (((undefined1  [12])LVar11 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
            local_f4._4_1_ = LVar11.field_1._0_1_;
            local_109 = local_f4._4_1_;
            goto LAB_00117b40;
          }
          local_f4._4_4_ = LVar11.field_1._0_4_;
          switch(local_f4._4_4_) {
          case 1:
            local_109 = 3;
            break;
          default:
            goto switchD_00117b07_caseD_2;
          case 6:
            local_109 = 8;
            break;
          case 0xb:
            local_109 = 3;
            break;
          case 0xe:
            local_109 = 0xd;
          }
LAB_00117b40:
          iVar8 = (int)(char)local_109;
          local_f4 = uVar2;
          if (iVar8 - 3U < 2) {
            local_150 = make_ptrlen("\r\n",2);
            term_write((Terminal *)ppVar5,local_150);
            safefree(local_40);
            ppVar6 = p_local;
            ppVar5 = local_18;
            local_18->data = (void *)0x0;
            make_spr_simple(&local_170,SPRK_USER_ABORT);
            spr_00.errfn = local_170.errfn;
            spr_00.kind = local_170.kind;
            spr_00._4_4_ = local_170._4_4_;
            spr_00.errdata_lit = local_170.errdata_lit;
            spr_00.errdata_u = local_170.errdata_u;
            spr_00._28_4_ = local_170._28_4_;
            signal_prompts_t(__return_storage_ptr__,(Terminal *)ppVar6,ppVar5,spr_00);
            return __return_storage_ptr__;
          }
          if (iVar8 != 8) {
            if ((iVar8 == 10) || (iVar8 == 0xd)) {
              local_120 = make_ptrlen("\r\n",2);
              term_write((Terminal *)ppVar5,local_120);
              *local_40 = *local_40 + 1;
              *(undefined1 *)(local_40 + 1) = 0;
              bVar3 = true;
              goto LAB_00117a66;
            }
            if ((iVar8 == 0x15) || (iVar8 == 0x1b)) {
              while (ppVar5 = p_local, ppVar1->result->len != 0) {
                if ((ppVar1->echo & 1U) != 0) {
                  local_140 = make_ptrlen("\b \b",3);
                  term_write((Terminal *)ppVar5,local_140);
                }
                strbuf_shrink_by(ppVar1->result,1);
              }
              goto LAB_00117a66;
            }
            if (iVar8 != 0x7f) {
              if ((((ppVar1->echo & 1U) == 0) ||
                  ((('\x1f' < (char)local_109 && ((char)local_109 < '\x7f')) || (0x9f < local_109)))
                  ) && (BinarySink_put_byte(ppVar1->result->binarysink_,local_109), ppVar5 = p_local
                       , (ppVar1->echo & 1U) != 0)) {
                local_180 = make_ptrlen(&local_109,1);
                term_write((Terminal *)ppVar5,local_180);
              }
              goto LAB_00117a66;
            }
          }
          if (ppVar1->result->len != 0) {
            if ((ppVar1->echo & 1U) != 0) {
              local_130 = make_ptrlen("\b \b",3);
              term_write((Terminal *)ppVar5,local_130);
            }
            strbuf_shrink_by(ppVar1->result,1);
          }
          goto LAB_00117a66;
        }
        goto LAB_001179c1;
      }
    }
    if (*local_40 < local_18->n_prompts) {
      ldisc_enable_prompt_callback((Ldisc *)p_local[0x21].callback,local_18);
      make_spr_simple(__return_storage_ptr__,SPRK_INCOMPLETE);
    }
    else {
      safefree(local_40);
      ppVar6 = p_local;
      ppVar5 = local_18;
      local_18->data = (void *)0x0;
      make_spr_simple(&local_1a0,SPRK_OK);
      spr_01.errfn = local_1a0.errfn;
      spr_01.kind = local_1a0.kind;
      spr_01._4_4_ = local_1a0._4_4_;
      spr_01.errdata_lit = local_1a0.errdata_lit;
      spr_01.errdata_u = local_1a0.errdata_u;
      spr_01._28_4_ = local_1a0._28_4_;
      signal_prompts_t(__return_storage_ptr__,(Terminal *)ppVar6,ppVar5,spr_01);
    }
  }
  else {
    uVar4 = *(undefined4 *)&(p->spr).field_0x4;
    __return_storage_ptr__->kind = (p->spr).kind;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar4;
    __return_storage_ptr__->errfn = (p->spr).errfn;
    __return_storage_ptr__->errdata_lit = (p->spr).errdata_lit;
    uVar4 = *(undefined4 *)&(p->spr).field_0x1c;
    __return_storage_ptr__->errdata_u = (p->spr).errdata_u;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar4;
  }
  return __return_storage_ptr__;
switchD_00117b07_caseD_2:
  local_f4 = uVar2;
  tok._0_4_ = uVar4;
  goto LAB_00117a66;
}

Assistant:

SeatPromptResult term_get_userpass_input(Terminal *term, prompts_t *p)
{
    if (!term->ldisc) {
        /* Can't handle interactive prompts without an ldisc */
        return signal_prompts_t(term, p, SPR_SW_ABORT(
            "Terminal not prepared for interactive prompts"));
    }

    if (p->spr.kind != SPRK_INCOMPLETE) {
        /* We've already finished these prompts, so return the same
         * result again */
        return p->spr;
    }

    struct term_userpass_state *s = (struct term_userpass_state *)p->data;

    if (!s) {
        /*
         * First call. Set some stuff up.
         */
        p->data = s = snew(struct term_userpass_state);
        p->spr = SPR_INCOMPLETE;
        s->curr_prompt = 0;
        s->done_prompt = false;
        /* We only print the `name' caption if we have to... */
        if (p->name_reqd && p->name) {
            ptrlen plname = ptrlen_from_asciz(p->name);
            term_write(term, plname);
            if (!ptrlen_endswith(plname, PTRLEN_LITERAL("\n"), NULL))
                term_write(term, PTRLEN_LITERAL("\r\n"));
        }
        /* ...but we always print any `instruction'. */
        if (p->instruction) {
            ptrlen plinst = ptrlen_from_asciz(p->instruction);
            term_write(term, plinst);
            if (!ptrlen_endswith(plinst, PTRLEN_LITERAL("\n"), NULL))
                term_write(term, PTRLEN_LITERAL("\r\n"));
        }
        /*
         * Zero all the results, in case we abort half-way through.
         */
        {
            int i;
            for (i = 0; i < (int)p->n_prompts; i++)
                prompt_set_result(p->prompts[i], "");
        }
    }

    while (s->curr_prompt < p->n_prompts) {

        prompt_t *pr = p->prompts[s->curr_prompt];
        bool finished_prompt = false;

        if (!s->done_prompt) {
            term_write(term, ptrlen_from_asciz(pr->prompt));
            s->done_prompt = true;
        }

        /* Breaking out here ensures that the prompt is printed even
         * if we're now waiting for user data. */
        if (!ldisc_has_input_buffered(term->ldisc))
            break;

        /* FIXME: should we be using local-line-editing code instead? */
        while (!finished_prompt && ldisc_has_input_buffered(term->ldisc)) {
            LdiscInputToken tok = ldisc_get_input_token(term->ldisc);

            char c;
            if (tok.is_special) {
                switch (tok.code) {
                  case SS_EOL: c = 13; break;
                  case SS_EC: c = 8; break;
                  case SS_IP: c = 3; break;
                  case SS_EOF: c = 3; break;
                  default: continue;
                }
            } else {
                c = tok.chr;
            }

            switch (c) {
              case 10:
              case 13:
                term_write(term, PTRLEN_LITERAL("\r\n"));
                /* go to next prompt, if any */
                s->curr_prompt++;
                s->done_prompt = false;
                finished_prompt = true; /* break out */
                break;
              case 8:
              case 127:
                if (pr->result->len > 0) {
                    if (pr->echo)
                        term_write(term, PTRLEN_LITERAL("\b \b"));
                    strbuf_shrink_by(pr->result, 1);
                }
                break;
              case 21:
              case 27:
                while (pr->result->len > 0) {
                    if (pr->echo)
                        term_write(term, PTRLEN_LITERAL("\b \b"));
                    strbuf_shrink_by(pr->result, 1);
                }
                break;
              case 3:
              case 4:
                /* Immediate abort. */
                term_write(term, PTRLEN_LITERAL("\r\n"));
                sfree(s);
                p->data = NULL;
                return signal_prompts_t(term, p, SPR_USER_ABORT);
              default:
                /*
                 * This simplistic check for printability is disabled
                 * when we're doing password input, because some people
                 * have control characters in their passwords.
                 */
                if (!pr->echo || (c >= ' ' && c <= '~') ||
                     ((unsigned char) c >= 160)) {
                    put_byte(pr->result, c);
                    if (pr->echo)
                        term_write(term, make_ptrlen(&c, 1));
                }
                break;
            }
        }

    }

    if (s->curr_prompt < p->n_prompts) {
        ldisc_enable_prompt_callback(term->ldisc, p);
        return SPR_INCOMPLETE;
    } else {
        sfree(s);
        p->data = NULL;
        return signal_prompts_t(term, p, SPR_OK);
    }
}